

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

void colamd_set_defaults(double *knobs)

{
  int local_14;
  int i;
  double *knobs_local;
  
  if (knobs != (double *)0x0) {
    for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
      knobs[local_14] = 0.0;
    }
    *knobs = 10.0;
    knobs[1] = 10.0;
    knobs[2] = 1.0;
  }
  return;
}

Assistant:

PUBLIC void COLAMD_set_defaults
(
    /* === Parameters ======================================================= */

    double knobs [COLAMD_KNOBS]		/* knob array */
)
{
    /* === Local variables ================================================== */

    Int i ;

    if (!knobs)
    {
	return ;			/* no knobs to initialize */
    }
    for (i = 0 ; i < COLAMD_KNOBS ; i++)
    {
	knobs [i] = 0 ;
    }
    knobs [COLAMD_DENSE_ROW] = 10 ;
    knobs [COLAMD_DENSE_COL] = 10 ;
    knobs [COLAMD_AGGRESSIVE] = TRUE ;	/* default: do aggressive absorption*/
}